

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

LINE_SIDE rr::LineRasterUtil::getVertexSide(Vector<long,_2> *v,SubpixelLineSegment *l)

{
  bool bVar1;
  SubpixelLineSegment *l_local;
  Vector<long,_2> *v_local;
  
  bVar1 = vertexOnLeftSideOfLine(v,l);
  if (bVar1) {
    v_local._4_4_ = LINE_SIDE_LEFT;
  }
  else {
    bVar1 = vertexOnRightSideOfLine(v,l);
    if (bVar1) {
      v_local._4_4_ = LINE_SIDE_RIGHT;
    }
    else {
      bVar1 = vertexOnLine(v,l);
      if (bVar1) {
        v_local._4_4_ = LINE_SIDE_INTERSECT;
      }
      else {
        v_local._4_4_ = LINE_SIDE_INTERSECT;
      }
    }
  }
  return v_local._4_4_;
}

Assistant:

static LINE_SIDE getVertexSide (const tcu::Vector<deInt64,2>& v, const SubpixelLineSegment& l)
{
	if (vertexOnLeftSideOfLine(v, l))
		return LINE_SIDE_LEFT;
	else if (vertexOnRightSideOfLine(v, l))
		return LINE_SIDE_RIGHT;
	else if (vertexOnLine(v, l))
		return LINE_SIDE_INTERSECT;
	else
	{
		DE_ASSERT(false);
		return LINE_SIDE_INTERSECT;
	}
}